

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O2

void __thiscall
embree::sse2::HeuristicStrandSplit::splitFallback
          (HeuristicStrandSplit *this,Set *set,PrimInfoRange *lset,PrimInfoRange *rset)

{
  unsigned_long uVar1;
  ulong uVar2;
  Geometry *pGVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t i;
  unsigned_long uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 local_b8 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar1 = set->_begin;
  uVar2 = set->_end;
  uVar9 = uVar1 + uVar2 >> 1;
  uVar7 = uVar1 << 5 | 0x1c;
  local_b8._0_4_ = (undefined4)DAT_01f45a40;
  local_b8._4_4_ = DAT_01f45a40._4_4_;
  local_b8._8_4_ = DAT_01f45a40._8_4_;
  local_b8._12_4_ = DAT_01f45a40._12_4_;
  aVar16 = _DAT_01f45a30;
  auVar17 = _DAT_01f45a40;
  aVar18 = _DAT_01f45a30;
  for (uVar10 = uVar1; uVar10 < uVar9; uVar10 = uVar10 + 1) {
    pGVar3 = (this->scene->geometries).items[*(uint *)((long)this->prims + (uVar7 - 0x10))].ptr;
    (*(pGVar3->super_RefCount)._vptr_RefCount[0x39])
              (local_58,pGVar3,(ulong)*(uint *)((long)&(this->prims->lower).field_0 + uVar7));
    aVar18.m128 = (__m128)minps(aVar18.m128,local_58);
    auVar17 = maxps(auVar17,local_48);
    fVar11 = local_58._0_4_ + local_48._0_4_;
    fVar12 = local_58._4_4_ + local_48._4_4_;
    fVar13 = local_58._8_4_ + local_48._8_4_;
    fVar14 = local_58._12_4_ + local_48._12_4_;
    auVar4._4_4_ = fVar12;
    auVar4._0_4_ = fVar11;
    auVar4._8_4_ = fVar13;
    auVar4._12_4_ = fVar14;
    aVar16.m128 = (__m128)minps(aVar16.m128,auVar4);
    auVar5._4_4_ = fVar12;
    auVar5._0_4_ = fVar11;
    auVar5._8_4_ = fVar13;
    auVar5._12_4_ = fVar14;
    auVar15 = maxps(local_b8,auVar5);
    local_b8._0_4_ = auVar15._0_4_;
    local_b8._4_4_ = auVar15._4_4_;
    local_b8._8_4_ = auVar15._8_4_;
    local_b8._12_4_ = auVar15._12_4_;
    uVar7 = uVar7 + 0x20;
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar18;
  *(undefined1 (*) [16])(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128 = auVar17;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar16;
  *(undefined4 *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_b8._0_4_;
  *(undefined4 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 4) =
       local_b8._4_4_;
  *(undefined4 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
       local_b8._8_4_;
  *(undefined4 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 0xc) =
       local_b8._12_4_;
  (lset->super_range<unsigned_long>)._begin = uVar1;
  (lset->super_range<unsigned_long>)._end = uVar9;
  uVar8 = uVar9 << 5 | 0x1c;
  local_b8._0_4_ = (undefined4)DAT_01f45a40;
  local_b8._4_4_ = DAT_01f45a40._4_4_;
  local_b8._8_4_ = DAT_01f45a40._8_4_;
  local_b8._12_4_ = DAT_01f45a40._12_4_;
  aVar16 = _DAT_01f45a30;
  auVar17 = _DAT_01f45a40;
  aVar18 = _DAT_01f45a30;
  for (uVar7 = uVar9; uVar7 < uVar2; uVar7 = uVar7 + 1) {
    pGVar3 = (this->scene->geometries).items[*(uint *)((long)this->prims + (uVar8 - 0x10))].ptr;
    (*(pGVar3->super_RefCount)._vptr_RefCount[0x39])
              (local_58,pGVar3,(ulong)*(uint *)((long)&(this->prims->lower).field_0 + uVar8));
    aVar18.m128 = (__m128)minps(aVar18.m128,local_58);
    auVar17 = maxps(auVar17,local_48);
    fVar11 = local_58._0_4_ + local_48._0_4_;
    fVar12 = local_58._4_4_ + local_48._4_4_;
    fVar13 = local_58._8_4_ + local_48._8_4_;
    fVar14 = local_58._12_4_ + local_48._12_4_;
    auVar15._4_4_ = fVar12;
    auVar15._0_4_ = fVar11;
    auVar15._8_4_ = fVar13;
    auVar15._12_4_ = fVar14;
    aVar16.m128 = (__m128)minps(aVar16.m128,auVar15);
    auVar6._4_4_ = fVar12;
    auVar6._0_4_ = fVar11;
    auVar6._8_4_ = fVar13;
    auVar6._12_4_ = fVar14;
    auVar15 = maxps(local_b8,auVar6);
    local_b8._0_4_ = auVar15._0_4_;
    local_b8._4_4_ = auVar15._4_4_;
    local_b8._8_4_ = auVar15._8_4_;
    local_b8._12_4_ = auVar15._12_4_;
    uVar8 = uVar8 + 0x20;
  }
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar18;
  *(undefined1 (*) [16])(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128 = auVar17;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar16;
  *(undefined4 *)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_b8._0_4_;
  *(undefined4 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 4) =
       local_b8._4_4_;
  *(undefined4 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
       local_b8._8_4_;
  *(undefined4 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 0xc) =
       local_b8._12_4_;
  (rset->super_range<unsigned_long>)._begin = uVar9;
  (rset->super_range<unsigned_long>)._end = uVar2;
  return;
}

Assistant:

void splitFallback(const Set& set, PrimInfoRange& lset, PrimInfoRange& rset)
      {
        const size_t begin = set.begin();
        const size_t end   = set.end();
        const size_t center = (begin + end)/2;
        
        CentGeomBBox3fa left(empty);
        for (size_t i=begin; i<center; i++)
          left.extend(bounds(prims[i]));
        new (&lset) PrimInfoRange(begin,center,left);
        
        CentGeomBBox3fa right(empty);
        for (size_t i=center; i<end; i++)
          right.extend(bounds(prims[i]));	
        new (&rset) PrimInfoRange(center,end,right);
      }